

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp++_test.cc
# Opt level: O2

void __thiscall osqp::anon_unknown_0::TwoDimensionalQpTest::SetUp(TwoDimensionalQpTest *this)

{
  _Alloc_hider _Var1;
  char *in_R9;
  AssertHelper AStack_2d8;
  Message local_2d0;
  string local_2c8;
  AssertionResult gtest_ar_;
  Triplet<double,_int> kTripletsA [1];
  SparseMatrix<double,_0,_int> constraint_matrix;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_240;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_220;
  OsqpInstance instance;
  OsqpSettings local_140;
  SparseMatrix<double,_0,_int> objective_matrix;
  Triplet<double,_int> kTripletsP [4];
  
  Eigen::SparseMatrix<double,_0,_int>::SparseMatrix(&objective_matrix,2,2);
  instance.objective_matrix._0_8_ = kTripletsP;
  kTripletsP[0].m_row = 0;
  kTripletsP[0].m_col = 0;
  kTripletsP[0].m_value = 2.0;
  kTripletsP[1].m_row = 1;
  kTripletsP[1].m_col = 0;
  kTripletsP[1].m_value = 0.5;
  kTripletsP[2].m_row = 0;
  kTripletsP[2].m_col = 1;
  kTripletsP[2].m_value = 0.5;
  kTripletsP[3].m_row = 1;
  kTripletsP[3].m_col = 1;
  kTripletsP[3].m_value = 2.0;
  local_140.rho = (double)&stack0xffffffffffffffe8;
  Eigen::SparseMatrix<double,0,int>::setFromTriplets<Eigen::Triplet<double,int>const*>
            ((SparseMatrix<double,0,int> *)&objective_matrix,(Triplet<double,_int> **)&instance,
             (Triplet<double,_int> **)&local_140);
  Eigen::SparseMatrix<double,_0,_int>::SparseMatrix(&constraint_matrix,1,2);
  instance.objective_matrix._0_8_ = kTripletsA;
  kTripletsA[0].m_row = 0;
  kTripletsA[0].m_col = 0;
  kTripletsA[0].m_value = 1.0;
  local_140.rho = (double)&constraint_matrix;
  Eigen::SparseMatrix<double,0,int>::setFromTriplets<Eigen::Triplet<double,int>const*>
            ((SparseMatrix<double,0,int> *)&constraint_matrix,(Triplet<double,_int> **)&instance,
             (Triplet<double,_int> **)&local_140);
  OsqpInstance::OsqpInstance(&instance);
  Eigen::SparseMatrix<double,0,long_long>::operator=
            ((SparseMatrix<double,0,long_long> *)&instance,
             (SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_> *)&objective_matrix);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&instance.objective_vector.
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,2);
  local_2c8._M_dataplus._M_p = (char *)0x0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::CommaInitializer
            ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_140,
             &instance.objective_vector,(Scalar *)&local_2c8);
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
            ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_140,
             (Scalar *)&gtest_ar_);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::finished
            ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_140);
  Eigen::SparseMatrix<double,0,long_long>::operator=
            ((SparseMatrix<double,0,long_long> *)&instance.constraint_matrix,
             (SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_> *)&constraint_matrix);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&instance.lower_bounds.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,1
            );
  local_140.rho = (double)&DAT_3ff0000000000000;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::CommaInitializer
            (&local_220,&instance.lower_bounds,&local_140.rho);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::finished(&local_220);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&instance.upper_bounds.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,1
            );
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::CommaInitializer
            (&local_240,&instance.upper_bounds,(Scalar *)&(anonymous_namespace)::kInfinity);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::finished(&local_240);
  OsqpSettings::OsqpSettings(&local_140);
  local_140.eps_abs = 1.0000000000000002e-06;
  local_140.eps_rel = 0.0;
  local_140.check_termination = 1;
  OsqpSolver::Init((OsqpSolver *)&local_2c8,(OsqpInstance *)&this->solver_,(OsqpSettings *)&instance
                  );
  _Var1._M_p = local_2c8._M_dataplus._M_p;
  gtest_ar_.success_ = local_2c8._M_dataplus._M_p == (char *)0x1;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  absl::Status::~Status((Status *)&local_2c8);
  if (_Var1._M_p != (char *)0x1) {
    testing::Message::Message(&local_2d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2c8,(internal *)&gtest_ar_,
               (AssertionResult *)"solver_.Init(instance, settings).ok()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_2d8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/test/osqp++_test.cc"
               ,0x145,local_2c8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&AStack_2d8,&local_2d0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_2d8);
    std::__cxx11::string::~string((string *)&local_2c8);
    if (local_2d0.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)local_2d0.ss_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  OsqpInstance::~OsqpInstance(&instance);
  Eigen::SparseMatrix<double,_0,_int>::~SparseMatrix(&constraint_matrix);
  Eigen::SparseMatrix<double,_0,_int>::~SparseMatrix(&objective_matrix);
  return;
}

Assistant:

void SetUp() override {
    // Minimize x^2 + (1/2)xy + y^2 subject to x >= 1.
    SparseMatrix<double> objective_matrix(2, 2);
    const Triplet<double> kTripletsP[] = {
        {0, 0, 2.0}, {1, 0, 0.5}, {0, 1, 0.5}, {1, 1, 2.0}};
    objective_matrix.setFromTriplets(std::begin(kTripletsP),
                                     std::end(kTripletsP));

    SparseMatrix<double> constraint_matrix(1, 2);
    const Triplet<double> kTripletsA[] = {{0, 0, 1.0}};
    constraint_matrix.setFromTriplets(std::begin(kTripletsA),
                                      std::end(kTripletsA));

    OsqpInstance instance;
    instance.objective_matrix = objective_matrix;
    instance.objective_vector.resize(2);
    instance.objective_vector << 0.0, 0.0;
    instance.constraint_matrix = constraint_matrix;
    instance.lower_bounds.resize(1);
    instance.lower_bounds << 1.0;
    instance.upper_bounds.resize(1);
    instance.upper_bounds << kInfinity;

    OsqpSettings settings;
    settings.eps_abs = kTolerance / 10;
    settings.eps_rel = 0.0;
    // check_termination is set so that the warm-started instance converges
    // immediately.
    settings.check_termination = 1;
    ASSERT_TRUE(solver_.Init(instance, settings).ok());
  }